

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O0

int nn_timerset_rm(nn_timerset *self,nn_timerset_hndl *hndl)

{
  int iVar1;
  nn_list_item *pnVar2;
  nn_list_item *in_RSI;
  nn_list *in_RDI;
  int first;
  nn_list_item *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  iVar1 = nn_list_item_isinlist(in_RSI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    pnVar2 = nn_list_begin(in_RDI);
    local_4 = (uint)(pnVar2 == in_RSI);
    nn_list_erase((nn_list *)(ulong)CONCAT14(pnVar2 == in_RSI,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffd8);
  }
  return local_4;
}

Assistant:

int nn_timerset_rm (struct nn_timerset *self, struct nn_timerset_hndl *hndl)
{
    int first;

    /*  Ignore if handle is not in the timeouts list. */
    if (!nn_list_item_isinlist (&hndl->list))
        return 0;

    /*  If it was the first timeout that was removed, the actual waiting time
        may have changed. We'll thus return 1 to let the user know. */
    first = nn_list_begin (&self->timeouts) == &hndl->list ? 1 : 0;
    nn_list_erase (&self->timeouts, &hndl->list);
    return first;
}